

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.h
# Opt level: O2

void __thiscall
FSectorTagIterator::FSectorTagIterator(FSectorTagIterator *this,int tag,line_t *line)

{
  int iVar1;
  
  if (tag == 0) {
    this->searchtag = -0x80000000;
    iVar1 = -1;
    if ((line != (line_t *)0x0) && (line->backsector != (sector_t *)0x0)) {
      iVar1 = (int)(((long)line->backsector - (long)sectors) / 0x268);
    }
  }
  else {
    this->searchtag = tag;
    iVar1 = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  this->start = iVar1;
  return;
}

Assistant:

FSectorTagIterator(int tag, line_t *line)
	{
		if (tag == 0)
		{
			searchtag = INT_MIN;
			start = (line == NULL || line->backsector == NULL)? -1 : (int)(line->backsector - sectors);
		}
		else
		{
			searchtag = tag;
			start = tagManager.TagHashFirst[((unsigned int)tag) % FTagManager::TAG_HASH_SIZE];
		}
	}